

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O1

void LatencyDumpDefaultImpl::addDumpTitle(stringstream *ss,size_t max_name_len)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  
  poVar1 = (ostream *)(ss + 0x10);
  lVar2 = *(long *)(ss + 0x10);
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(ss + lVar3 + 0x28) = *(uint *)(ss + lVar3 + 0x28) & 0xffffff4f | 0x20;
  *(long *)(ss + *(long *)(lVar2 + -0x18) + 0x20) = (long)(int)max_name_len;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"STAT NAME",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  lVar2 = *(long *)(ss + 0x10);
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(ss + lVar3 + 0x28) = *(uint *)(ss + lVar3 + 0x28) & 0xffffff4f | 0x80;
  *(undefined8 *)(ss + *(long *)(lVar2 + -0x18) + 0x20) = 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TOTAL",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 7;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"RATIO",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CALLS",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"AVERAGE",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"p50",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"p99",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  *(undefined8 *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) = 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"p99.9",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)(ss + 0x10) + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

static void addDumpTitle(std::stringstream& ss, size_t max_name_len) {
        ss << std::left << std::setw(max_name_len) << "STAT NAME" << ": ";
        ss << std::right;
        ss << std::setw(8) << "TOTAL" << " ";
        ss << std::setw(7) << "RATIO" << " ";
        ss << std::setw(6) << "CALLS" << " ";
        ss << std::setw(8) << "AVERAGE" << " ";
        ss << std::setw(8) << "p50" << " ";
        ss << std::setw(8) << "p99" << " ";
        ss << std::setw(8) << "p99.9";
        ss << std::endl;
    }